

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O3

void __thiscall
btSliderConstraint::getInfo2NonVirtual
          (btSliderConstraint *this,btConstraintInfo2 *info,btTransform *transA,btTransform *transB,
          btVector3 *linVelA,btVector3 *linVelB,btScalar rbAinvMass,btScalar rbBinvMass)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  btScalar *pbVar4;
  btRigidBody *pbVar5;
  btRigidBody *pbVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  btScalar *pbVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  char cVar16;
  long lVar17;
  btScalar *pbVar18;
  btScalar *pbVar19;
  btScalar *pbVar20;
  btScalar *pbVar21;
  long lVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  btScalar bVar36;
  btScalar bVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  btScalar bVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  btScalar bVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 local_158 [8];
  float fStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [28];
  float local_12c;
  undefined1 local_128 [8];
  float fStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [16];
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  btScalar bStack_f4;
  btScalar bStack_f0;
  btScalar bStack_ec;
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  uint local_c0;
  float local_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  btScalar bStack_84;
  btScalar bStack_80;
  btScalar bStack_7c;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  btVector3 *local_68;
  btVector3 *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar8 = local_118;
  auVar9 = _local_158;
  iVar13 = info->rowskip;
  local_12c = 1.0;
  if (this->m_useLinearReferenceFrameA == false) {
    local_12c = -1.0;
  }
  uVar23 = -(uint)(0.0 < rbAinvMass + rbBinvMass);
  fVar33 = (float)(~uVar23 & 0x3f000000 | (uint)(rbBinvMass / (rbAinvMass + rbBinvMass)) & uVar23);
  fVar35 = 1.0 - fVar33;
  fVar46 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  fVar54 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  fVar47 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  fVar29 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
  fVar49 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
  fVar50 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
  bVar2 = this->m_useOffsetForConstraintFrame;
  if (bVar2 == true) {
    fVar24 = fVar29 * fVar35 + fVar46 * fVar33;
    fVar28 = fVar49 * fVar35 + fVar54 * fVar33;
    fVar32 = fVar35 * fVar50 + fVar33 * fVar47;
    fStack_fc = 1.0 / SQRT(fVar32 * fVar32 + fVar24 * fVar24 + fVar28 * fVar28);
    fVar32 = fVar32 * fStack_fc;
    fVar24 = fStack_fc * fVar24;
    fVar28 = fStack_fc * fVar28;
    fStack_100 = fStack_fc * (fVar35 * 0.0 + fVar33 * 0.0);
    fStack_fc = fStack_fc * (fVar35 * 0.0 + fVar33 * 0.0);
    if (ABS(fVar32) <= 0.70710677) {
      fVar25 = fVar24 * fVar24 + fVar28 * fVar28;
      fVar43 = 1.0 / SQRT(fVar25);
      bStack_f4 = -0.0;
      bStack_84 = -fVar28;
      bStack_80 = -fVar28;
      bStack_7c = -fVar28;
      local_88 = -fVar28 * fVar43;
      local_a8 = fVar24 * fVar43;
      bVar44 = -fVar32 * local_a8;
      bVar36 = local_88 * fVar32;
      bVar37 = fVar43 * fVar25;
      local_d8 = 0.0;
      fStack_d4 = 0.0;
      fStack_d0 = 0.0;
      fStack_cc = 0.0;
      fStack_a4 = fVar28;
      fStack_a0 = fStack_100;
      fStack_9c = fStack_fc;
    }
    else {
      fVar43 = fVar28 * fVar28 + fVar32 * fVar32;
      fStack_cc = 1.0 / SQRT(fVar43);
      bVar44 = fVar43 * fStack_cc;
      local_d8 = fVar28 * fStack_cc;
      local_a8 = -fVar32 * fStack_cc;
      fStack_d0 = fVar28 * fStack_cc;
      fStack_cc = fVar28 * fStack_cc;
      bVar36 = -fVar24 * local_d8;
      bVar37 = fVar24 * local_a8;
      local_88 = 0.0;
      bStack_84 = 0.0;
      bStack_80 = 0.0;
      bStack_7c = 0.0;
      bStack_f4 = fVar28;
      fStack_a4 = local_a8;
      fStack_a0 = local_a8;
      fStack_9c = local_a8;
      fStack_d4 = local_a8;
    }
    local_158._4_4_ = local_a8;
    local_158._0_4_ = local_88;
    uStack_14c = auVar9._12_4_;
    fStack_150 = local_d8;
    local_118._8_4_ = bVar37;
    local_118._4_4_ = bVar36;
    local_118._12_4_ = auVar8._12_4_;
    local_118._0_4_ = bVar44;
    bStack_f0 = bStack_f4;
    bStack_ec = bStack_f4;
  }
  else {
    fStack_100 = 0.0;
    fStack_fc = 0.0;
    local_88 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
    bStack_84 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
    bStack_80 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[3];
    bStack_7c = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
    local_a8 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    fStack_a4 = 0.0;
    fStack_a0 = 0.0;
    fStack_9c = 0.0;
    local_d8 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    fStack_d4 = 0.0;
    fStack_d0 = 0.0;
    fStack_cc = 0.0;
    local_158._4_4_ = local_a8;
    local_158._0_4_ = local_88;
    fStack_150 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    uStack_14c = 0;
    bVar44 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
    bStack_f4 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[3];
    bStack_f0 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
    bStack_ec = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    bVar36 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    bVar37 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    local_118._4_4_ = bVar36;
    local_118._0_4_ = bVar44;
    local_118._8_4_ = bVar37;
    local_118._12_4_ = 0;
    fVar24 = fVar46;
    fVar28 = fVar54;
    fVar32 = fVar47;
  }
  local_e8 = ZEXT416((uint)fVar32);
  local_c0 = -(uint)(rbBinvMass < 1.1920929e-07 || rbAinvMass < 1.1920929e-07);
  fVar25 = (this->m_calculatedTransformB).m_origin.m_floats[0] -
           (this->m_calculatedTransformA).m_origin.m_floats[0];
  fVar26 = (this->m_calculatedTransformB).m_origin.m_floats[1] -
           (this->m_calculatedTransformA).m_origin.m_floats[1];
  local_bc = (this->m_calculatedTransformB).m_origin.m_floats[2] -
             (this->m_calculatedTransformA).m_origin.m_floats[2];
  pbVar18 = info->m_J1angularAxis;
  *pbVar18 = local_88;
  pbVar18[1] = local_a8;
  pbVar18[2] = local_d8;
  pbVar18[iVar13] = bVar44;
  pbVar18[(long)iVar13 + 1] = bVar36;
  pbVar18[(long)iVar13 + 2] = bVar37;
  pbVar19 = info->m_J2angularAxis;
  *pbVar19 = -local_88;
  pbVar19[1] = -local_a8;
  pbVar19[2] = -local_d8;
  pbVar19[iVar13] = -bVar44;
  pbVar19[(long)iVar13 + 1] = -bVar36;
  pbVar19[(long)iVar13 + 2] = -bVar37;
  uVar23 = this->m_flags;
  fVar43 = this->m_softnessOrthoAng;
  if (-1 < (char)uVar23) {
    fVar43 = fVar43 * info->erp;
  }
  fVar43 = fVar43 * info->fps;
  fVar27 = fVar54 * fVar50 - fVar49 * fVar47;
  fVar47 = fVar47 * fVar29 - fVar50 * fVar46;
  fVar46 = fVar46 * fVar49 - fVar29 * fVar54;
  pbVar10 = info->m_constraintError;
  *pbVar10 = (fVar46 * local_d8 + fVar27 * local_88 + fVar47 * local_a8) * fVar43;
  pbVar10[iVar13] = (fVar46 * bVar37 + fVar27 * bVar44 + fVar47 * bVar36) * fVar43;
  if ((uVar23 & 0x40) != 0) {
    bVar48 = this->m_cfmOrthoAng;
    pbVar20 = info->cfm;
    *pbVar20 = bVar48;
    pbVar20[iVar13] = bVar48;
  }
  fVar46 = (transA->m_origin).m_floats[2];
  uVar1 = *(undefined8 *)(transA->m_origin).m_floats;
  fVar47 = (float)uVar1;
  fVar29 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(transB->m_origin).m_floats;
  fVar49 = (float)uVar1;
  fVar50 = (float)((ulong)uVar1 >> 0x20);
  fVar54 = (transB->m_origin).m_floats[2];
  _local_128 = ZEXT816(0);
  lVar15 = (long)(iVar13 * 2);
  lVar17 = (long)(iVar13 * 3);
  local_108 = CONCAT44(fVar28,fVar24);
  if (bVar2 == false) {
    fVar49 = fVar49 - fVar47;
    fVar50 = fVar50 - fVar29;
    fVar54 = fVar54 - fVar46;
    local_148._0_8_ = CONCAT44(fVar50,fVar49);
    local_98._4_4_ = fVar54 * local_88 - local_d8 * fVar49;
    local_98._0_4_ = fVar50 * local_d8 - local_a8 * fVar54;
    local_98._8_4_ = fVar49 * local_a8 - local_88 * fVar50;
    local_98._12_4_ = 0;
    lVar22 = 0;
    do {
      pbVar18[lVar15 + lVar22] = *(float *)(local_98 + lVar22 * 4) * fVar33;
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    do {
      pbVar19[lVar15 + lVar22] = *(float *)(local_98 + lVar22 * 4) * fVar35;
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_98._4_4_ = fVar54 * bVar44 + -fVar49 * bVar37;
    local_98._0_4_ = fVar50 * bVar37 + -fVar54 * bVar36;
    local_98._8_4_ = fVar49 * bVar36 + -fVar50 * bVar44;
    local_98._12_4_ = 0;
    lVar22 = 0;
    do {
      pbVar18[lVar17 + lVar22] = *(float *)(local_98 + lVar22 * 4) * fVar33;
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    do {
      pbVar19[lVar17 + lVar22] = *(float *)(local_98 + lVar22 * 4) * fVar35;
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    pbVar20 = info->m_J1linearAxis;
    pbVar20[lVar15 + 2] = fStack_150;
    *(undefined1 (*) [8])(pbVar20 + lVar15) = local_158;
    pbVar20[lVar17 + 2] = (btScalar)local_118._8_4_;
    *(undefined8 *)(pbVar20 + lVar17) = local_118._0_8_;
    pbVar21 = info->m_J2linearAxis;
    lVar22 = 0;
    do {
      pbVar21[lVar15 + lVar22] = -*(btScalar *)(local_158 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    do {
      pbVar21[lVar17 + lVar22] = -*(btScalar *)(local_118 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    _local_b8 = ZEXT816(0);
    fVar47 = 0.0;
    local_78 = 0.0;
    fStack_74 = 0.0;
    uStack_70 = 0;
    fVar43 = 0.0;
  }
  else {
    fVar34 = this->m_linPos - (this->m_depth).m_floats[0];
    uVar1 = *(undefined8 *)(this->m_calculatedTransformB).m_origin.m_floats;
    fVar49 = (float)uVar1 - fVar49;
    fVar50 = (float)((ulong)uVar1 >> 0x20) - fVar50;
    uVar1 = *(undefined8 *)(this->m_calculatedTransformA).m_origin.m_floats;
    fVar47 = (float)uVar1 - fVar47;
    fVar29 = (float)((ulong)uVar1 >> 0x20) - fVar29;
    fVar54 = (this->m_calculatedTransformB).m_origin.m_floats[2] - fVar54;
    fVar46 = (this->m_calculatedTransformA).m_origin.m_floats[2] - fVar46;
    fVar55 = (this->m_sliderAxis).m_floats[0] - 0.0;
    fVar56 = (this->m_sliderAxis).m_floats[1] - 0.0;
    fVar38 = fVar54 * fVar32 + fVar24 * fVar49 + fVar50 * fVar28;
    fVar40 = fVar46 * fVar32 + fVar24 * fVar47 + fVar29 * fVar28;
    fVar49 = fVar49 - fVar38 * fVar24;
    fVar51 = fVar50 - fVar38 * fVar28;
    fVar52 = 0.0 - fVar38 * fStack_100;
    fVar53 = 0.0 - fVar38 * fStack_fc;
    fVar47 = fVar47 - fVar40 * fVar24;
    fVar27 = fVar29 - fVar40 * fVar28;
    fVar30 = 0.0 - fVar40 * fStack_100;
    fVar31 = 0.0 - fVar40 * fStack_fc;
    fVar54 = fVar54 - fVar32 * fVar38;
    fVar46 = fVar46 - fVar32 * fVar40;
    fVar45 = (fVar32 * fVar40 + fVar32 * fVar34) - fVar32 * fVar38;
    fVar43 = fVar46 + fVar33 * fVar45;
    fVar39 = (fVar40 * fVar24 + fVar34 * fVar24) - fVar38 * fVar24;
    fVar41 = (fVar40 * fVar28 + fVar34 * fVar28) - fVar38 * fVar28;
    fVar42 = (fVar40 * fStack_100 + fVar34 * fStack_100) - fVar38 * fStack_100;
    fVar34 = (fVar40 * fStack_fc + fVar34 * fStack_fc) - fVar38 * fStack_fc;
    local_78 = fVar33 * fVar39 + fVar47;
    fStack_74 = fVar33 * fVar41 + fVar27;
    uStack_70 = CONCAT44(fVar33 * fVar34 + fVar31,fVar33 * fVar42 + fVar30);
    local_b8._0_4_ = fVar49 - fVar39 * fVar35;
    local_b8._4_4_ = fVar51 - fVar41 * fVar35;
    fStack_b0 = fVar52 - fVar42 * fVar35;
    fStack_ac = fVar53 - fVar34 * fVar35;
    fVar49 = fVar47 * fVar35 + fVar33 * fVar49;
    fVar27 = fVar27 * fVar35 + fVar33 * fVar51;
    fVar46 = fVar35 * fVar46;
    fVar47 = fVar54 - fVar45 * fVar35;
    local_d8 = fVar46 + fVar33 * fVar54;
    fStack_d4 = fVar46 + fVar46;
    fStack_d0 = fVar46 + (fVar55 - fVar32 * (fVar55 * fVar32 + fVar24 * fVar50 + fVar28 * 0.0)) *
                         0.0;
    fStack_cc = fVar46 + (fVar56 - fVar32 * (fVar56 * fVar32 + fVar24 * fVar29 + fVar28 * 0.0)) *
                         0.0;
    fVar46 = local_d8 * local_d8 + fVar49 * fVar49 + fVar27 * fVar27;
    if (fVar46 <= 1.1920929e-07) {
      local_88 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
      bStack_80 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[3];
      bStack_7c = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
      local_a8 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
      local_d8 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
      fStack_d4 = 0.0;
      fStack_d0 = 0.0;
      fStack_cc = 0.0;
      local_158._4_4_ = local_a8;
      local_158._0_4_ = local_88;
      fStack_150 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
      uStack_14c = 0;
    }
    else {
      fVar46 = 1.0 / SQRT(fVar46);
      local_d8 = local_d8 * fVar46;
      local_88 = fVar49 * fVar46;
      local_a8 = fVar27 * fVar46;
      bStack_80 = (fVar30 * fVar35 + fVar33 * fVar52) * fVar46;
      bStack_7c = (fVar31 * fVar35 + fVar33 * fVar53) * fVar46;
      local_158._4_4_ = local_a8;
      local_158._0_4_ = local_88;
      fStack_150 = local_d8;
      uStack_14c = 0;
    }
    local_58 = ZEXT416((uint)fVar43);
    local_48 = ZEXT416((uint)fVar47);
    bVar44 = fVar28 * local_d8 - local_a8 * fVar32;
    bVar36 = fVar32 * local_88 - local_d8 * fVar24;
    bVar37 = fVar24 * local_a8 - local_88 * fVar28;
    local_118._8_4_ = bVar37;
    local_118._0_8_ = CONCAT44(bVar36,bVar44);
    local_118._12_4_ = 0;
    local_128._4_4_ = fVar47 * local_88 - local_d8 * (float)local_b8._0_4_;
    local_128._0_4_ = (float)local_b8._4_4_ * local_d8 - local_a8 * fVar47;
    fStack_120 = local_a8 * (float)local_b8._0_4_ - local_88 * (float)local_b8._4_4_;
    uStack_11c = 0;
    *(ulong *)(pbVar18 + lVar15) =
         CONCAT44(fVar43 * local_88 - local_d8 * local_78,fStack_74 * local_d8 - local_a8 * fVar43);
    pbVar18[lVar15 + 2] = local_78 * local_a8 - local_88 * fStack_74;
    lVar22 = 0;
    do {
      pbVar19[lVar15 + lVar22] = -*(btScalar *)(local_128 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    fVar49 = fStack_74 * bVar37 + -fVar43 * bVar36;
    fVar46 = fVar43 * bVar44 + -local_78 * bVar37;
    bVar48 = local_78 * bVar36 + -fStack_74 * bVar44;
    fVar54 = (float)local_b8._4_4_ * bVar37 + -fVar47 * bVar36;
    fVar50 = fVar47 * bVar44 + bVar37 * -(float)local_b8._0_4_;
    fVar29 = (float)local_b8._0_4_ * bVar36 + -(float)local_b8._4_4_ * bVar44;
    local_128._4_4_ = fVar50;
    local_128._0_4_ = fVar54;
    fStack_120 = fVar29;
    uStack_11c = 0;
    if (((local_c0 & 1) != 0) && (this->m_solveAngLim == true)) {
      local_128._4_4_ = fVar50 * fVar35;
      local_128._0_4_ = fVar54 * fVar35;
      fStack_120 = fVar29 * fVar35;
      uStack_11c = 0;
      fVar49 = fVar49 * fVar33;
      fVar46 = fVar46 * fVar33;
      bVar48 = bVar48 * fVar33;
    }
    *(ulong *)(pbVar18 + lVar17) = CONCAT44(fVar46,fVar49);
    pbVar18[lVar17 + 2] = bVar48;
    lVar22 = 0;
    do {
      pbVar19[lVar17 + lVar22] = -*(btScalar *)(local_128 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    pbVar20 = info->m_J1linearAxis;
    pbVar20[lVar15 + 2] = fStack_150;
    *(undefined1 (*) [8])(pbVar20 + lVar15) = local_158;
    pbVar20[lVar17 + 2] = bVar37;
    *(ulong *)(pbVar20 + lVar17) = CONCAT44(bVar36,bVar44);
    pbVar21 = info->m_J2linearAxis;
    lVar22 = 0;
    do {
      pbVar21[lVar15 + lVar22] = -*(btScalar *)(local_158 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    do {
      pbVar21[lVar17 + lVar22] = -*(btScalar *)(local_118 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_148._0_8_ = 0;
    fVar54 = 0.0;
    bStack_f4 = fVar28;
    bStack_f0 = fVar28;
    bStack_ec = fVar28;
    fStack_a4 = local_a8;
    fStack_a0 = local_a8;
    fStack_9c = local_a8;
    bStack_84 = local_a8;
  }
  local_148._8_8_ = 0;
  auVar9 = local_148._0_16_;
  fVar46 = this->m_softnessOrthoLin;
  if ((uVar23 & 0x20) == 0) {
    fVar46 = fVar46 * info->erp;
  }
  fVar46 = fVar46 * info->fps;
  pbVar10[lVar15] = (local_d8 * local_bc + local_88 * fVar25 + local_a8 * fVar26) * fVar46;
  pbVar10[lVar17] = (bVar37 * local_bc + bVar44 * fVar25 + fVar26 * bVar36) * fVar46;
  if ((uVar23 & 0x10) != 0) {
    bVar36 = this->m_cfmOrthoLin;
    pbVar4 = info->cfm;
    pbVar4[lVar15] = bVar36;
    pbVar4[lVar17] = bVar36;
  }
  bVar3 = this->m_solveLinLim;
  local_148._4_4_ = (undefined4)((ulong)local_148._0_8_ >> 0x20);
  local_68 = linVelA;
  local_60 = linVelB;
  if (bVar3 == true) {
    local_f8 = (this->m_depth).m_floats[0] * local_12c;
    bVar7 = local_f8 <= 0.0;
    cVar16 = this->m_poweredLinMotor;
LAB_001a4c0a:
    iVar11 = iVar13 * 4;
    iVar12 = iVar13 * 4 + 1;
    *(ulong *)(pbVar20 + iVar11) = local_108;
    iVar13 = iVar13 * 4 + 2;
    pbVar20[iVar13] = fVar32;
    *(ulong *)(pbVar21 + iVar11) = local_108 ^ 0x8000000080000000;
    pbVar21[iVar13] = -fVar32;
    if (bVar2 == false) {
      fVar46 = (float)local_148._4_4_ * fVar32 - fVar28 * fVar54;
      pbVar18[iVar11] = fVar33 * fVar46;
      fVar54 = fVar54 * fVar24 - fVar32 * (float)local_148._0_4_;
      fVar47 = (float)local_148._0_4_ * fVar28 - fVar24 * (float)local_148._4_4_;
      *(ulong *)(pbVar18 + iVar12) = CONCAT44(fVar33 * fVar47,fVar33 * fVar54);
      pbVar19[iVar11] = fVar46 * fVar35;
      pbVar19[iVar12] = fVar35 * fVar54;
      bVar36 = fVar47 * fVar35;
LAB_001a4d75:
      pbVar19[iVar13] = bVar36;
    }
    else if ((local_c0 & 1) == 0) {
      fStack_120 = (float)local_b8._0_4_ * fVar28 - (float)local_b8._4_4_ * fVar24;
      pbVar18[iVar11] = fStack_74 * fVar32 - fVar28 * fVar43;
      *(ulong *)(pbVar18 + iVar12) =
           CONCAT44(local_78 * fVar28 - fVar24 * fStack_74,fVar43 * fVar24 - fVar32 * local_78);
      local_128._0_4_ = (float)local_b8._4_4_ * fVar32 - fVar28 * fVar47;
      local_128._4_4_ = fVar47 * fVar24 - fVar32 * (float)local_b8._0_4_;
      uStack_11c = 0;
      *(ulong *)(pbVar19 + iVar11) = CONCAT44(local_128._4_4_,local_128._0_4_) ^ 0x8000000080000000;
      bVar36 = -fStack_120;
      goto LAB_001a4d75;
    }
    local_d8 = this->m_lowerLinLimit;
    fVar46 = this->m_upperLinLimit;
    pbVar10[iVar11] = 0.0;
    pbVar18 = info->m_lowerLimit;
    pbVar18[iVar11] = 0.0;
    pbVar19 = info->m_upperLimit;
    pbVar19[iVar11] = 0.0;
    pbVar20 = &info->erp;
    if ((uVar23 >> 9 & 1) != 0) {
      pbVar20 = &this->m_softnessLimLin;
    }
    fVar54 = *pbVar20;
    local_148._0_16_ = auVar9;
    if ((cVar16 != '\0') && ((local_d8 == fVar46 & bVar3) == 0)) {
      if ((uVar23 & 1) != 0) {
        info->cfm[iVar11] = this->m_cfmDirLin;
      }
      local_a8 = fVar46;
      bVar36 = btTypedConstraint::getMotorFactor
                         (&this->super_btTypedConstraint,this->m_linPos,this->m_lowerLinLimit,
                          this->m_upperLinLimit,this->m_targetLinMotorVelocity,info->fps * fVar54);
      pbVar10 = info->m_constraintError;
      pbVar10[iVar11] = pbVar10[iVar11] - bVar36 * local_12c * this->m_targetLinMotorVelocity;
      pbVar18 = info->m_lowerLimit;
      pbVar18[iVar11] = pbVar18[iVar11] - this->m_maxLinMotorForce / info->fps;
      pbVar19 = info->m_upperLimit;
      pbVar19[iVar11] = this->m_maxLinMotorForce / info->fps + pbVar19[iVar11];
      fVar46 = local_a8;
      fVar24 = (float)local_108;
      fVar28 = local_108._4_4_;
      fVar32 = (float)local_e8._0_4_;
    }
    uVar14 = 5;
    auVar9 = local_148._0_16_;
    if (bVar3 != false) {
      pbVar10[iVar11] = fVar54 * info->fps * local_f8 + pbVar10[iVar11];
      if ((this->m_flags & 0x100) != 0) {
        info->cfm[iVar11] = this->m_cfmLimLin;
      }
      if ((local_d8 != fVar46) || (NAN(local_d8) || NAN(fVar46))) {
        if (!bVar7) {
          pbVar18[iVar11] = 0.0;
          goto LAB_001a4f4d;
        }
        pbVar18[iVar11] = -3.4028235e+38;
        pbVar19[iVar11] = 0.0;
      }
      else {
        pbVar18[iVar11] = -3.4028235e+38;
LAB_001a4f4d:
        pbVar19[iVar11] = 3.4028235e+38;
      }
      fVar46 = 1.0 - this->m_dampingLimLin;
      if (fVar46 == 0.0) {
        fVar54 = pbVar10[iVar11];
      }
      else {
        fVar46 = ABS(fVar46);
        fVar47 = local_12c *
                 ((local_68->m_floats[2] * fVar32 +
                  local_68->m_floats[0] * fVar24 + local_68->m_floats[1] * fVar28) -
                 (local_60->m_floats[2] * fVar32 +
                 local_60->m_floats[0] * fVar24 + fVar28 * local_60->m_floats[1]));
        fVar54 = pbVar10[iVar11];
        if (bVar7) {
          if ((fVar47 < 0.0) && (fVar47 = fVar47 * -fVar46, fVar54 < fVar47)) {
LAB_001a5020:
            fVar54 = fVar47;
            pbVar10[iVar11] = fVar54;
          }
        }
        else if ((0.0 < fVar47) && (fVar47 = fVar47 * -fVar46, fVar47 < fVar54)) goto LAB_001a5020;
      }
      pbVar10[iVar11] = fVar54 * this->m_softnessLimLin;
    }
  }
  else {
    uVar14 = 4;
    if (this->m_poweredLinMotor == true) {
      local_f8 = 0.0;
      bVar7 = false;
      cVar16 = '\x01';
      goto LAB_001a4c0a;
    }
  }
  local_148._0_16_ = auVar9;
  bVar2 = this->m_solveAngLim;
  if (bVar2 == true) {
    fVar46 = this->m_angDepth;
    bVar3 = 0.0 < fVar46;
    cVar16 = this->m_poweredAngMotor;
  }
  else {
    if (this->m_poweredAngMotor != true) {
      return;
    }
    fVar46 = 0.0;
    bVar3 = false;
    cVar16 = '\x01';
  }
  lVar15 = (ulong)uVar14 * (long)info->rowskip;
  pbVar18 = info->m_J1angularAxis;
  *(ulong *)(pbVar18 + lVar15) = CONCAT44(fVar28,fVar24);
  pbVar18[(long)(int)lVar15 + 2] = fVar32;
  pbVar18 = info->m_J2angularAxis;
  *(ulong *)(pbVar18 + lVar15) = CONCAT44(fVar28,fVar24) ^ 0x8000000080000000;
  pbVar18[(long)(int)lVar15 + 2] = -fVar32;
  local_f8 = this->m_lowerAngLimit;
  local_d8 = this->m_upperAngLimit;
  pbVar18 = &info->erp;
  if (((uint)this->m_flags >> 0xb & 1) != 0) {
    pbVar18 = &this->m_softnessLimAng;
  }
  fVar54 = *pbVar18;
  if ((cVar16 != '\0') && ((local_f8 == local_d8 & bVar2) == 0)) {
    bVar36 = local_f8;
    bVar37 = local_d8;
    if ((this->m_flags & 4U) != 0) {
      info->cfm[lVar15] = this->m_cfmDirAng;
      bVar36 = this->m_lowerAngLimit;
      bVar37 = this->m_upperAngLimit;
    }
    bVar36 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,this->m_angPos,bVar36,bVar37,
                        this->m_targetAngMotorVelocity,info->fps * fVar54);
    pbVar10 = info->m_constraintError;
    pbVar10[lVar15] = bVar36 * this->m_targetAngMotorVelocity;
    info->m_lowerLimit[lVar15] = -this->m_maxAngMotorForce / info->fps;
    info->m_upperLimit[lVar15] = this->m_maxAngMotorForce / info->fps;
    fVar24 = (float)local_108;
    fVar28 = local_108._4_4_;
    fVar32 = (float)local_e8._0_4_;
  }
  if (bVar2 == false) {
    return;
  }
  pbVar10[lVar15] = fVar54 * info->fps * fVar46 + pbVar10[lVar15];
  if ((this->m_flags & 0x400) != 0) {
    info->cfm[lVar15] = this->m_cfmLimAng;
  }
  if ((local_f8 != local_d8) || (NAN(local_f8) || NAN(local_d8))) {
    bVar36 = 0.0;
    bVar37 = 0.0;
    if (bVar3) {
      bVar36 = 3.4028235e+38;
    }
    else {
      bVar37 = -3.4028235e+38;
    }
  }
  else {
    bVar36 = 3.4028235e+38;
    bVar37 = -3.4028235e+38;
  }
  info->m_lowerLimit[lVar15] = bVar37;
  info->m_upperLimit[lVar15] = bVar36;
  fVar46 = 1.0 - this->m_dampingLimAng;
  if (fVar46 == 0.0) {
    fVar54 = pbVar10[lVar15];
  }
  else {
    fVar46 = ABS(fVar46);
    pbVar5 = (this->super_btTypedConstraint).m_rbA;
    pbVar6 = (this->super_btTypedConstraint).m_rbB;
    fVar47 = ((pbVar5->m_angularVelocity).m_floats[2] * fVar32 +
             (pbVar5->m_angularVelocity).m_floats[0] * fVar24 +
             (pbVar5->m_angularVelocity).m_floats[1] * fVar28) -
             ((pbVar6->m_angularVelocity).m_floats[2] * fVar32 +
             fVar24 * (pbVar6->m_angularVelocity).m_floats[0] +
             fVar28 * (pbVar6->m_angularVelocity).m_floats[1]);
    fVar54 = pbVar10[lVar15];
    if (bVar3) {
      if ((0.0 <= fVar47) || (bVar36 = fVar47 * -fVar46, bVar36 <= fVar54)) goto LAB_001a5327;
    }
    else if ((fVar47 <= 0.0) || (bVar36 = fVar47 * -fVar46, fVar54 <= bVar36)) goto LAB_001a5327;
    pbVar10[lVar15] = bVar36;
    fVar54 = bVar36;
  }
LAB_001a5327:
  pbVar10[lVar15] = fVar54 * this->m_softnessLimAng;
  return;
}

Assistant:

void btSliderConstraint::getInfo2NonVirtual(btConstraintInfo2* info, const btTransform& transA,const btTransform& transB, const btVector3& linVelA,const btVector3& linVelB, btScalar rbAinvMass,btScalar rbBinvMass  )
{
	const btTransform& trA = getCalculatedTransformA();
	const btTransform& trB = getCalculatedTransformB();
	
	btAssert(!m_useSolveConstraintObsolete);
	int i, s = info->rowskip;
	
	btScalar signFact = m_useLinearReferenceFrameA ? btScalar(1.0f) : btScalar(-1.0f);
	
	// difference between frames in WCS
	btVector3 ofs = trB.getOrigin() - trA.getOrigin();
	// now get weight factors depending on masses
	btScalar miA = rbAinvMass;
	btScalar miB = rbBinvMass;
	bool hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	btScalar factA, factB;
	if(miS > btScalar(0.f))
	{
		factA = miB / miS;
	}
	else 
	{
		factA = btScalar(0.5f);
	}
	factB = btScalar(1.0f) - factA;
	btVector3 ax1, p, q;
	btVector3 ax1A = trA.getBasis().getColumn(0);
	btVector3 ax1B = trB.getBasis().getColumn(0);
	if(m_useOffsetForConstraintFrame)
	{
		// get the desired direction of slider axis
		// as weighted sum of X-orthos of frameA and frameB in WCS
		ax1 = ax1A * factA + ax1B * factB;
		ax1.normalize();
		// construct two orthos to slider axis
		btPlaneSpace1 (ax1, p, q);
	}
	else
	{ // old way - use frameA
		ax1 = trA.getBasis().getColumn(0);
		// get 2 orthos to slider axis (Y, Z)
		p = trA.getBasis().getColumn(1);
		q = trA.getBasis().getColumn(2);
	}
	// make rotations around these orthos equal
	// the slider axis should be the only unconstrained
	// rotational axis, the angular velocity of the two bodies perpendicular to
	// the slider axis should be equal. thus the constraint equations are
	//    p*w1 - p*w2 = 0
	//    q*w1 - q*w2 = 0
	// where p and q are unit vectors normal to the slider axis, and w1 and w2
	// are the angular velocity vectors of the two bodies.
	info->m_J1angularAxis[0] = p[0];
	info->m_J1angularAxis[1] = p[1];
	info->m_J1angularAxis[2] = p[2];
	info->m_J1angularAxis[s+0] = q[0];
	info->m_J1angularAxis[s+1] = q[1];
	info->m_J1angularAxis[s+2] = q[2];

	info->m_J2angularAxis[0] = -p[0];
	info->m_J2angularAxis[1] = -p[1];
	info->m_J2angularAxis[2] = -p[2];
	info->m_J2angularAxis[s+0] = -q[0];
	info->m_J2angularAxis[s+1] = -q[1];
	info->m_J2angularAxis[s+2] = -q[2];
	// compute the right hand side of the constraint equation. set relative
	// body velocities along p and q to bring the slider back into alignment.
	// if ax1A,ax1B are the unit length slider axes as computed from bodyA and
	// bodyB, we need to rotate both bodies along the axis u = (ax1 x ax2).
	// if "theta" is the angle between ax1 and ax2, we need an angular velocity
	// along u to cover angle erp*theta in one step :
	//   |angular_velocity| = angle/time = erp*theta / stepsize
	//                      = (erp*fps) * theta
	//    angular_velocity  = |angular_velocity| * (ax1 x ax2) / |ax1 x ax2|
	//                      = (erp*fps) * theta * (ax1 x ax2) / sin(theta)
	// ...as ax1 and ax2 are unit length. if theta is smallish,
	// theta ~= sin(theta), so
	//    angular_velocity  = (erp*fps) * (ax1 x ax2)
	// ax1 x ax2 is in the plane space of ax1, so we project the angular
	// velocity to p and q to find the right hand side.
//	btScalar k = info->fps * info->erp * getSoftnessOrthoAng();
	btScalar currERP = (m_flags & BT_SLIDER_FLAGS_ERP_ORTANG) ? m_softnessOrthoAng : m_softnessOrthoAng * info->erp;
	btScalar k = info->fps * currERP;

	btVector3 u = ax1A.cross(ax1B);
	info->m_constraintError[0] = k * u.dot(p);
	info->m_constraintError[s] = k * u.dot(q);
	if(m_flags & BT_SLIDER_FLAGS_CFM_ORTANG)
	{
		info->cfm[0] = m_cfmOrthoAng;
		info->cfm[s] = m_cfmOrthoAng;
	}

	int nrow = 1; // last filled row
	int srow;
	btScalar limit_err;
	int limit;
	int powered;

	// next two rows. 
	// we want: velA + wA x relA == velB + wB x relB ... but this would
	// result in three equations, so we project along two orthos to the slider axis

	btTransform bodyA_trans = transA;
	btTransform bodyB_trans = transB;
	nrow++;
	int s2 = nrow * s;
	nrow++;
	int s3 = nrow * s;
	btVector3 tmpA(0,0,0), tmpB(0,0,0), relA(0,0,0), relB(0,0,0), c(0,0,0);
	if(m_useOffsetForConstraintFrame)
	{
		// get vector from bodyB to frameB in WCS
		relB = trB.getOrigin() - bodyB_trans.getOrigin();
		// get its projection to slider axis
		btVector3 projB = ax1 * relB.dot(ax1);
		// get vector directed from bodyB to slider axis (and orthogonal to it)
		btVector3 orthoB = relB - projB;
		// same for bodyA
		relA = trA.getOrigin() - bodyA_trans.getOrigin();
		btVector3 projA = ax1 * relA.dot(ax1);
		btVector3 orthoA = relA - projA;
		// get desired offset between frames A and B along slider axis
		btScalar sliderOffs = m_linPos - m_depth[0];
		// desired vector from projection of center of bodyA to projection of center of bodyB to slider axis
		btVector3 totalDist = projA + ax1 * sliderOffs - projB;
		// get offset vectors relA and relB
		relA = orthoA + totalDist * factA;
		relB = orthoB - totalDist * factB;
		// now choose average ortho to slider axis
		p = orthoB * factA + orthoA * factB;
		btScalar len2 = p.length2();
		if(len2 > SIMD_EPSILON)
		{
			p /= btSqrt(len2);
		}
		else
		{
			p = trA.getBasis().getColumn(1);
		}
		// make one more ortho
		q = ax1.cross(p);
		// fill two rows
		tmpA = relA.cross(p);
		tmpB = relB.cross(p);
		for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = -tmpB[i];
		tmpA = relA.cross(q);
		tmpB = relB.cross(q);
		if(hasStaticBody && getSolveAngLimit())
		{ // to make constraint between static and dynamic objects more rigid
			// remove wA (or wB) from equation if angular limit is hit
			tmpB *= factB;
			tmpA *= factA;
		}
		for (i=0; i<3; i++) info->m_J1angularAxis[s3+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s3+i] = -tmpB[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s3+i] = q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s3+i] = -q[i];
	}
	else
	{	// old way - maybe incorrect if bodies are not on the slider axis
		// see discussion "Bug in slider constraint" http://bulletphysics.org/Bullet/phpBB3/viewtopic.php?f=9&t=4024&start=0
		c = bodyB_trans.getOrigin() - bodyA_trans.getOrigin();
		btVector3 tmp = c.cross(p);
		for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = factA*tmp[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = factB*tmp[i];
		tmp = c.cross(q);
		for (i=0; i<3; i++) info->m_J1angularAxis[s3+i] = factA*tmp[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s3+i] = factB*tmp[i];

		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s3+i] = q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s3+i] = -q[i];
	}
	// compute two elements of right hand side

	//	k = info->fps * info->erp * getSoftnessOrthoLin();
	currERP = (m_flags & BT_SLIDER_FLAGS_ERP_ORTLIN) ? m_softnessOrthoLin : m_softnessOrthoLin * info->erp;
	k = info->fps * currERP;

	btScalar rhs = k * p.dot(ofs);
	info->m_constraintError[s2] = rhs;
	rhs = k * q.dot(ofs);
	info->m_constraintError[s3] = rhs;
	if(m_flags & BT_SLIDER_FLAGS_CFM_ORTLIN)
	{
		info->cfm[s2] = m_cfmOrthoLin;
		info->cfm[s3] = m_cfmOrthoLin;
	}


	// check linear limits
	limit_err = btScalar(0.0);
	limit = 0;
	if(getSolveLinLimit())
	{
		limit_err = getLinDepth() *  signFact;
		limit = (limit_err > btScalar(0.0)) ? 2 : 1;
	}
	powered = 0;
	if(getPoweredLinMotor())
	{
		powered = 1;
	}
	// if the slider has joint limits or motor, add in the extra row
	if (limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1linearAxis[srow+0] = ax1[0];
		info->m_J1linearAxis[srow+1] = ax1[1];
		info->m_J1linearAxis[srow+2] = ax1[2];
		info->m_J2linearAxis[srow+0] = -ax1[0];
		info->m_J2linearAxis[srow+1] = -ax1[1];
		info->m_J2linearAxis[srow+2] = -ax1[2];
		// linear torque decoupling step:
		//
		// we have to be careful that the linear constraint forces (+/- ax1) applied to the two bodies
		// do not create a torque couple. in other words, the points that the
		// constraint force is applied at must lie along the same ax1 axis.
		// a torque couple will result in limited slider-jointed free
		// bodies from gaining angular momentum.
		if(m_useOffsetForConstraintFrame)
		{
			// this is needed only when bodyA and bodyB are both dynamic.
			if(!hasStaticBody)
			{
				tmpA = relA.cross(ax1);
				tmpB = relB.cross(ax1);
				info->m_J1angularAxis[srow+0] = tmpA[0];
				info->m_J1angularAxis[srow+1] = tmpA[1];
				info->m_J1angularAxis[srow+2] = tmpA[2];
				info->m_J2angularAxis[srow+0] = -tmpB[0];
				info->m_J2angularAxis[srow+1] = -tmpB[1];
				info->m_J2angularAxis[srow+2] = -tmpB[2];
			}
		}
		else
		{ // The old way. May be incorrect if bodies are not on the slider axis
			btVector3 ltd;	// Linear Torque Decoupling vector (a torque)
			ltd = c.cross(ax1);
			info->m_J1angularAxis[srow+0] = factA*ltd[0];
			info->m_J1angularAxis[srow+1] = factA*ltd[1];
			info->m_J1angularAxis[srow+2] = factA*ltd[2];
			info->m_J2angularAxis[srow+0] = factB*ltd[0];
			info->m_J2angularAxis[srow+1] = factB*ltd[1];
			info->m_J2angularAxis[srow+2] = factB*ltd[2];
		}
		// right-hand part
		btScalar lostop = getLowerLinLimit();
		btScalar histop = getUpperLinLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		info->m_constraintError[srow] = 0.;
		info->m_lowerLimit[srow] = 0.;
		info->m_upperLimit[srow] = 0.;
		currERP = (m_flags & BT_SLIDER_FLAGS_ERP_LIMLIN) ? m_softnessLimLin : info->erp;
		if(powered)
		{
			if(m_flags & BT_SLIDER_FLAGS_CFM_DIRLIN)
			{
				info->cfm[srow] = m_cfmDirLin;
			}
			btScalar tag_vel = getTargetLinMotorVelocity();
			btScalar mot_fact = getMotorFactor(m_linPos, m_lowerLinLimit, m_upperLinLimit, tag_vel, info->fps * currERP);
			info->m_constraintError[srow] -= signFact * mot_fact * getTargetLinMotorVelocity();
			info->m_lowerLimit[srow] += -getMaxLinMotorForce() / info->fps;
			info->m_upperLimit[srow] += getMaxLinMotorForce() / info->fps;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_SLIDER_FLAGS_CFM_LIMLIN)
			{
				info->cfm[srow] = m_cfmLimLin;
			}
			if(lostop == histop) 
			{	// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimLin) for that)
			btScalar bounce = btFabs(btScalar(1.0) - getDampingLimLin());
			if(bounce > btScalar(0.0))
			{
				btScalar vel = linVelA.dot(ax1);
				vel -= linVelB.dot(ax1);
				vel *= signFact;
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if (newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{ // high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow]) 
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
			info->m_constraintError[srow] *= getSoftnessLimLin();
		} // if(limit)
	} // if linear limit
	// check angular limits
	limit_err = btScalar(0.0);
	limit = 0;
	if(getSolveAngLimit())
	{
		limit_err = getAngDepth();
		limit = (limit_err > btScalar(0.0)) ? 1 : 2;
	}
	// if the slider has joint limits, add in the extra row
	powered = 0;
	if(getPoweredAngMotor())
	{
		powered = 1;
	}
	if(limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1angularAxis[srow+0] = ax1[0];
		info->m_J1angularAxis[srow+1] = ax1[1];
		info->m_J1angularAxis[srow+2] = ax1[2];

		info->m_J2angularAxis[srow+0] = -ax1[0];
		info->m_J2angularAxis[srow+1] = -ax1[1];
		info->m_J2angularAxis[srow+2] = -ax1[2];

		btScalar lostop = getLowerAngLimit();
		btScalar histop = getUpperAngLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		currERP = (m_flags & BT_SLIDER_FLAGS_ERP_LIMANG) ? m_softnessLimAng : info->erp;
		if(powered)
		{
			if(m_flags & BT_SLIDER_FLAGS_CFM_DIRANG)
			{
				info->cfm[srow] = m_cfmDirAng;
			}
			btScalar mot_fact = getMotorFactor(m_angPos, m_lowerAngLimit, m_upperAngLimit, getTargetAngMotorVelocity(), info->fps * currERP);
			info->m_constraintError[srow] = mot_fact * getTargetAngMotorVelocity();
			info->m_lowerLimit[srow] = -getMaxAngMotorForce() / info->fps;
			info->m_upperLimit[srow] = getMaxAngMotorForce() / info->fps;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_SLIDER_FLAGS_CFM_LIMANG)
			{
				info->cfm[srow] = m_cfmLimAng;
			}
			if(lostop == histop) 
			{
				// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimAng) for that)
			btScalar bounce = btFabs(btScalar(1.0) - getDampingLimAng());
			if(bounce > btScalar(0.0))
			{
				btScalar vel = m_rbA.getAngularVelocity().dot(ax1);
				vel -= m_rbB.getAngularVelocity().dot(ax1);
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if(newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{	// high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
			info->m_constraintError[srow] *= getSoftnessLimAng();
		} // if(limit)
	} // if angular limit or powered
}